

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall BotscriptParser::BotscriptParser(BotscriptParser *this)

{
  DataBuffer *pDVar1;
  Lexer *this_00;
  
  this->m_isReadOnly = false;
  pDVar1 = (DataBuffer *)operator_new(0xb8);
  DataBuffer::DataBuffer(pDVar1,0x80);
  this->m_mainBuffer = pDVar1;
  pDVar1 = (DataBuffer *)operator_new(0xb8);
  DataBuffer::DataBuffer(pDVar1,0x80);
  this->m_onenterBuffer = pDVar1;
  pDVar1 = (DataBuffer *)operator_new(0xb8);
  DataBuffer::DataBuffer(pDVar1,0x80);
  this->m_mainLoopBuffer = pDVar1;
  this->m_switchBuffer = (DataBuffer *)0x0;
  this_00 = (Lexer *)operator_new(0x70);
  Lexer::Lexer(this_00);
  this->m_lexer = this_00;
  this->m_numStates = 0;
  this->m_numEvents = 0;
  this->m_currentMode = TopLevel;
  (this->m_currentState)._string._M_dataplus._M_p = (pointer)&(this->m_currentState)._string.field_2
  ;
  (this->m_currentState)._string._M_string_length = 0;
  (this->m_currentState)._string.field_2._M_local_buf[0] = '\0';
  this->m_isStateSpawnDefined = false;
  this->m_gotMainLoop = false;
  this->m_scopeCursor = -1;
  this->m_isElseAllowed = false;
  this->m_highestGlobalVarIndex = 0;
  this->m_highestStateVarIndex = 0;
  std::_Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>::_Deque_base
            ((_Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_> *)&this->m_scopeStack);
  return;
}

Assistant:

BotscriptParser::BotscriptParser() :
	m_isReadOnly (false),
	m_mainBuffer (new DataBuffer),
	m_onenterBuffer (new DataBuffer),
	m_mainLoopBuffer (new DataBuffer),
	m_switchBuffer (nullptr),
	m_lexer (new Lexer),
	m_numStates (0),
	m_numEvents (0),
	m_currentMode (ParserMode::TopLevel),
	m_isStateSpawnDefined (false),
	m_gotMainLoop (false),
	m_scopeCursor (-1),
	m_isElseAllowed (false),
	m_highestGlobalVarIndex (0),
	m_highestStateVarIndex (0) {}